

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> * __thiscall
wasm::WATParser::anon_unknown_0::LexFloatCtx::lexed
          (optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *__return_storage_ptr__,
          LexFloatCtx *this)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  size_type sVar3;
  const_pointer pvVar4;
  char *__nptr;
  long lVar5;
  long lVar6;
  LexResult *pLVar7;
  __type_conflict1 __x;
  LexFloatResult local_2e8;
  double local_2c0;
  double d;
  char *last;
  string str;
  char *end;
  char *curr;
  stringstream ss;
  ostream local_260 [376];
  LexFloatResult local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  LexFloatResult local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined1 local_38 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> basic;
  double negNan;
  double posNan;
  LexFloatCtx *this_local;
  
  __x = std::copysign<float,double>(NAN,1.0);
  basic.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
       = std::copysign<float,double>(NAN,-1.0);
  bVar1 = std::signbit(__x);
  if (bVar1) {
    __assert_fail("!std::signbit(posNan) && \"expected positive NaN to be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/lexer.cpp"
                  ,0xf3,
                  "std::optional<LexFloatResult> wasm::WATParser::(anonymous namespace)::LexFloatCtx::lexed()"
                 );
  }
  bVar1 = std::signbit((double)basic.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._16_8_);
  if (!bVar1) {
    __assert_fail("std::signbit(negNan) && \"expected negative NaN to be negative\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/lexer.cpp"
                  ,0xf4,
                  "std::optional<LexFloatResult> wasm::WATParser::(anonymous namespace)::LexFloatCtx::lexed()"
                 );
  }
  LexCtx::lexed((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38,
                &this->super_LexCtx);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_38);
  if (bVar1) {
    pbVar2 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38)->
              span;
    local_48 = std::basic_string_view<char,_std::char_traits<char>_>::substr(pbVar2,0,3);
    local_58 = sv("nan",3);
    bVar1 = std::operator==(local_48,local_58);
    if (!bVar1) {
      pbVar2 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                          ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38)
                ->span;
      local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr(pbVar2,0,4);
      local_78 = sv("+nan",4);
      bVar1 = std::operator==(local_68,local_78);
      if (!bVar1) {
        pbVar2 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                            ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38
                            )->span;
        local_b0 = std::basic_string_view<char,_std::char_traits<char>_>::substr(pbVar2,0,4);
        local_c0 = sv("-nan",4);
        bVar1 = std::operator==(local_b0,local_c0);
        if (bVar1) {
          pLVar7 = std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator*
                             ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                              local_38);
          local_e8.super_LexResult.span._M_len = (pLVar7->span)._M_len;
          local_e8.super_LexResult.span._M_str = (pLVar7->span)._M_str;
          local_e8.nanPayload.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload =
               (this->nanPayload).super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          local_e8.nanPayload.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged =
               (this->nanPayload).super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
          local_e8.nanPayload.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._9_7_ =
               *(undefined7 *)
                &(this->nanPayload).super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>.field_0x9;
          local_e8.d = (double)basic.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                               ._16_8_;
          std::optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult>::
          optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true>
                    (__return_storage_ptr__,&local_e8);
          return __return_storage_ptr__;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&curr);
        pbVar2 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                            ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38
                            )->span;
        end = std::basic_string_view<char,_std::char_traits<char>_>::data(pbVar2);
        pbVar2 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                            ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38
                            )->span;
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar2);
        pvVar4 = end + sVar3;
        for (; end != pvVar4; end = end + 1) {
          if (*end != '_') {
            std::operator<<(local_260,*end);
          }
        }
        std::__cxx11::stringstream::str();
        __nptr = (char *)std::__cxx11::string::data();
        local_2c0 = strtod(__nptr,(char **)&d);
        lVar5 = std::__cxx11::string::data();
        lVar6 = std::__cxx11::string::size();
        if (d == (double)(lVar5 + lVar6)) {
          pLVar7 = std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator*
                             ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                              local_38);
          local_2e8.super_LexResult.span._M_len = (pLVar7->span)._M_len;
          local_2e8.super_LexResult.span._M_str = (pLVar7->span)._M_str;
          std::optional<unsigned_long>::optional(&local_2e8.nanPayload);
          local_2e8.d = local_2c0;
          std::optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult>::
          optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true>
                    (__return_storage_ptr__,&local_2e8);
          std::__cxx11::string::~string((string *)&last);
          std::__cxx11::stringstream::~stringstream((stringstream *)&curr);
          return __return_storage_ptr__;
        }
        __assert_fail("last == str.data() + str.size() && \"could not parse float\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/lexer.cpp"
                      ,0x112,
                      "std::optional<LexFloatResult> wasm::WATParser::(anonymous namespace)::LexFloatCtx::lexed()"
                     );
      }
    }
    pLVar7 = std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator*
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_38);
    local_a0.super_LexResult.span._M_len = (pLVar7->span)._M_len;
    local_a0.super_LexResult.span._M_str = (pLVar7->span)._M_str;
    local_a0.nanPayload.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload =
         (this->nanPayload).super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_a0.nanPayload.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged =
         (this->nanPayload).super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    local_a0.nanPayload.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ =
         *(undefined7 *)
          &(this->nanPayload).super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>.field_0x9;
    local_a0.d = __x;
    std::optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult>::
    optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult,_true>
              (__return_storage_ptr__,&local_a0);
  }
  else {
    std::optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult>::optional
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexFloatResult> lexed() {
    const double posNan = std::copysign(NAN, 1.0);
    const double negNan = std::copysign(NAN, -1.0);
    assert(!std::signbit(posNan) && "expected positive NaN to be positive");
    assert(std::signbit(negNan) && "expected negative NaN to be negative");
    auto basic = LexCtx::lexed();
    if (!basic) {
      return {};
    }
    // strtod does not return NaNs with the expected signs on all platforms.
    // TODO: use starts_with once we have C++20.
    if (basic->span.substr(0, 3) == "nan"sv ||
        basic->span.substr(0, 4) == "+nan"sv) {
      return LexFloatResult{*basic, nanPayload, posNan};
    }
    if (basic->span.substr(0, 4) == "-nan"sv) {
      return LexFloatResult{*basic, nanPayload, negNan};
    }
    // Do not try to implement fully general and precise float parsing
    // ourselves. Instead, call out to std::strtod to do our parsing. This means
    // we need to strip any underscores since `std::strtod` does not understand
    // them.
    std::stringstream ss;
    for (const char *curr = basic->span.data(),
                    *end = curr + basic->span.size();
         curr != end;
         ++curr) {
      if (*curr != '_') {
        ss << *curr;
      }
    }
    std::string str = ss.str();
    char* last;
    double d = std::strtod(str.data(), &last);
    assert(last == str.data() + str.size() && "could not parse float");
    return LexFloatResult{*basic, {}, d};
  }